

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

format_decimal_result<char_*> __thiscall
fmt::v8::detail::format_decimal<char,unsigned__int128>
          (detail *this,char *out,unsigned___int128 value,int size)

{
  ulong uVar1;
  int iVar2;
  undefined8 in_RAX;
  int in_ECX;
  undefined4 in_register_00000014;
  ulong uVar3;
  undefined8 unaff_RBX;
  char *pcVar4;
  ulong uVar5;
  detail *pdVar6;
  detail *pdVar7;
  bool bVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  format_decimal_result<char_*> fVar11;
  detail *pdVar12;
  
  uVar3 = CONCAT44(in_register_00000014,size);
  auVar10._8_8_ = unaff_RBX;
  auVar10._0_8_ = in_RAX;
  iVar2 = count_digits_fallback<unsigned__int128>((detail *)out,(unsigned___int128)auVar10);
  if (in_ECX < iVar2) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/tosinalagbe[P]hedg/include/fmt/format.h"
                ,0x44a,"invalid digit count");
  }
  pdVar6 = this + in_ECX;
  pcVar4 = out;
  uVar5 = uVar3;
  pdVar7 = pdVar6;
  pdVar12 = pdVar6;
  if ((out < (char *)0x64) <= uVar3) {
    do {
      pdVar6 = pdVar7 + -2;
      auVar10 = __udivti3(pcVar4,uVar5,100,0);
      uVar3 = auVar10._8_8_;
      out = auVar10._0_8_;
      bVar8 = (char *)0x270f < pcVar4;
      bVar9 = uVar5 != 0;
      uVar1 = -uVar5;
      *(char (*) [2])(pdVar7 + -2) = basic_data<void>::digits[(long)(pcVar4 + (long)out * -100)];
      pcVar4 = out;
      uVar5 = uVar3;
      pdVar7 = pdVar6;
    } while (bVar9 || uVar1 < bVar8);
  }
  if (uVar3 == 0 && (ulong)((char *)0x9 < out) <= -uVar3) {
    pdVar6[-1] = (detail)((byte)out | 0x30);
    pdVar6 = pdVar6 + -1;
  }
  else {
    *(char (*) [2])(pdVar6 + -2) = basic_data<void>::digits[(long)out];
    pdVar6 = pdVar6 + -2;
  }
  fVar11.end = (char *)pdVar12;
  fVar11.begin = (char *)pdVar6;
  return fVar11;
}

Assistant:

FMT_CONSTEXPR20 auto format_decimal(Char* out, UInt value, int size)
    -> format_decimal_result<Char*> {
  FMT_ASSERT(size >= count_digits(value), "invalid digit count");
  out += size;
  Char* end = out;
  if (is_constant_evaluated()) {
    while (value >= 10) {
      *--out = static_cast<Char>('0' + value % 10);
      value /= 10;
    }
    *--out = static_cast<Char>('0' + value);
    return {out, end};
  }
  while (value >= 100) {
    // Integer division is slow so do it for a group of two digits instead
    // of for every digit. The idea comes from the talk by Alexandrescu
    // "Three Optimization Tips for C++". See speed-test for a comparison.
    out -= 2;
    copy2(out, data::digits[value % 100]);
    value /= 100;
  }
  if (value < 10) {
    *--out = static_cast<Char>('0' + value);
    return {out, end};
  }
  out -= 2;
  copy2(out, data::digits[value]);
  return {out, end};
}